

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O3

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
trng::utility::operator<<
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *out,
          io_range<const_unsigned_long_*> *IO_range)

{
  unsigned_long *puVar1;
  
  if (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0) {
    puVar1 = IO_range->first;
    do {
      if (puVar1 == IO_range->last) {
        return out;
      }
      std::wostream::_M_insert<unsigned_long>((ulong)out);
      puVar1 = puVar1 + 1;
      if ((puVar1 != IO_range->last) && (IO_range->delim_str != (char *)0x0)) {
        std::operator<<((wostream *)out,IO_range->delim_str);
      }
    } while (((byte)out[*(long *)(*(long *)out + -0x18) + 0x20] & 5) == 0);
  }
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(std::basic_ostream<char_t, traits_t> &out,
                                                     const io_range<T> &IO_range) {
      T pos{IO_range.first};
      while (out and pos != IO_range.last) {
        out << (*pos);
        ++pos;
        if (pos != IO_range.last and IO_range.delim_str != 0)
          out << IO_range.delim_str;
      }
      return out;
    }